

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd_builtins.c
# Opt level: O2

nsh_status_t cmd_builtin_version(uint argc,char **argv)

{
  nsh_io_printf("Nsh version %u.%u.%u",1,4,0);
  return NSH_STATUS_OK;
}

Assistant:

nsh_status_t cmd_builtin_version(unsigned int argc, char** argv)
{
    NSH_UNUSED(argc);
    NSH_UNUSED(argv);
#if NSH_FEATURE_USE_PRINTF == 1
    nsh_io_printf("Nsh version %u.%u.%u", NSH_VERSION_MAJOR, NSH_VERSION_MINOR, NSH_VERSION_PATCH);
#else
    nsh_io_put_string("Nsh version " NSH_VERSION_STRING);
#endif
    return NSH_STATUS_OK;
}